

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O1

CPalThread * CreateCurrentThreadData(void)

{
  BOOL BVar1;
  PAL_ERROR PVar2;
  CPalThread *local_20;
  CPalThread *pThread;
  
  local_20 = (CPalThread *)0x0;
  BVar1 = PALIsThreadDataInitialized();
  if (BVar1 != 0) {
    PVar2 = AllocatePalThread(&local_20);
    if (PVar2 != 0) {
      fprintf(_stderr,"] %s %s:%d","CreateCurrentThreadData",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,99);
      fprintf(_stderr,"Unable to allocate pal thread: error %d - aborting\n",(ulong)PVar2);
      abort();
    }
  }
  return local_20;
}

Assistant:

CPalThread *
CreateCurrentThreadData()
{
    CPalThread *pThread = NULL;

    if (PALIsThreadDataInitialized()) {
        PAL_ERROR palError = AllocatePalThread(&pThread);
        if (NO_ERROR != palError)
        {
            ASSERT("Unable to allocate pal thread: error %d - aborting\n", palError);
            abort();
        }
    }

    return pThread;
}